

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileUtilityTargetGenerator::WriteRuleFiles(cmMakefileUtilityTargetGenerator *this)

{
  cmMakefile *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmGeneratedFileStream *os;
  bool bVar3;
  ostream *poVar4;
  string *psVar5;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar6;
  char *path;
  char *pcVar7;
  string hack;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  cmMakefileTargetGenerator::CreateRuleFile(&this->super_cmMakefileTargetGenerator);
  poVar4 = std::operator<<((ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,
                           "# Utility rule file for ");
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  poVar4 = std::operator<<(poVar4,(string *)psVar5);
  std::operator<<(poVar4,".\n\n");
  if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
    this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::__cxx11::string::string
              ((string *)&local_88,"CMAKE_MAKE_INCLUDE_FROM_ROOT",(allocator *)&local_48);
    bVar3 = cmMakefile::IsOn(this_00,&local_88);
    pcVar7 = "";
    if (bVar3) {
      pcVar7 = "$(CMAKE_BINARY_DIR)/";
    }
    std::__cxx11::string::~string((string *)&local_88);
    poVar4 = std::operator<<((ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,
                             "# Include the progress variables for this target.\n");
    poVar4 = std::operator<<(poVar4,(string *)
                                    &((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
                                     IncludeDirective);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,pcVar7);
    pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar7 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar1);
    std::__cxx11::string::string((string *)&local_68,pcVar7,&local_89);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_48,pcVar1,&local_68,
               &(this->super_cmMakefileTargetGenerator).ProgressFileNameFull);
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              (&local_88,(cmSystemTools *)local_48._M_dataplus._M_p,path);
    poVar4 = std::operator<<(poVar4,(string *)&local_88);
    std::operator<<(poVar4,"\n\n");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  cmMakefileTargetGenerator::WriteTargetBuildRules(&this->super_cmMakefileTargetGenerator);
  local_48.field_2._M_allocated_capacity = 0;
  local_68.field_2._M_allocated_capacity = 0;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar6 = cmGeneratorTarget::GetPreBuildCommands
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmLocalUnixMakefileGenerator3::AppendCustomDepends
            (pcVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_68,pvVar6);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar6 = cmGeneratorTarget::GetPostBuildCommands
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmLocalUnixMakefileGenerator3::AppendCustomDepends
            (pcVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_68,pvVar6);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar6 = cmGeneratorTarget::GetPreBuildCommands
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar7 = cmLocalGenerator::GetBinaryDirectory
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  std::__cxx11::string::string((string *)&local_88,pcVar7,&local_89);
  cmLocalUnixMakefileGenerator3::AppendCustomCommands
            (pcVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_48,pvVar6,pcVar2,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  cmMakefileTargetGenerator::DriveCustomCommands
            (&this->super_cmMakefileTargetGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar6 = cmGeneratorTarget::GetPostBuildCommands
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar7 = cmLocalGenerator::GetBinaryDirectory
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  std::__cxx11::string::string((string *)&local_88,pcVar7,&local_89);
  cmLocalUnixMakefileGenerator3::AppendCustomCommands
            (pcVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_48,pvVar6,pcVar2,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  cmMakefileTargetGenerator::AppendTargetDepends
            (&this->super_cmMakefileTargetGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68);
  cmLocalUnixMakefileGenerator3::AppendRuleDepend
            ((this->super_cmMakefileTargetGenerator).LocalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68,(this->super_cmMakefileTargetGenerator).BuildFileNameFull._M_dataplus._M_p
            );
  if ((local_68._M_dataplus._M_p == (pointer)local_68._M_string_length) &&
     (local_48._M_dataplus._M_p == (pointer)local_48._M_string_length)) {
    std::__cxx11::string::string
              ((string *)&local_88,
               (string *)
               &((this->super_cmMakefileTargetGenerator).GlobalGenerator)->EmptyRuleHackDepends);
    if (local_88._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_68,&local_88);
    }
    std::__cxx11::string::~string((string *)&local_88);
  }
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  os = (this->super_cmMakefileTargetGenerator).BuildFileStream;
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (pcVar1,(ostream *)os,(char *)0x0,psVar5,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48,true,false);
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmMakefileTargetGenerator::WriteTargetDriverRule
            (&this->super_cmMakefileTargetGenerator,psVar5,false);
  cmMakefileTargetGenerator::WriteTargetCleanRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetDependRules(&this->super_cmMakefileTargetGenerator);
  (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
    _vptr_cmCommonTargetGenerator[5])(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  return;
}

Assistant:

void cmMakefileUtilityTargetGenerator::WriteRuleFiles()
{
  this->CreateRuleFile();

  *this->BuildFileStream << "# Utility rule file for "
                         << this->GeneratorTarget->GetName() << ".\n\n";

  if (!this->NoRuleMessages) {
    const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")
                          ? "$(CMAKE_BINARY_DIR)/"
                          : "");
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator
             ->MaybeConvertToRelativePath(
               this->LocalGenerator->GetBinaryDirectory(),
               this->ProgressFileNameFull)
             .c_str())
      << "\n\n";
  }

  // write the custom commands for this target
  this->WriteTargetBuildRules();

  // Collect the commands and dependencies.
  std::vector<std::string> commands;
  std::vector<std::string> depends;

  // Utility targets store their rules in pre- and post-build commands.
  this->LocalGenerator->AppendCustomDepends(
    depends, this->GeneratorTarget->GetPreBuildCommands());

  this->LocalGenerator->AppendCustomDepends(
    depends, this->GeneratorTarget->GetPostBuildCommands());

  this->LocalGenerator->AppendCustomCommands(
    commands, this->GeneratorTarget->GetPreBuildCommands(),
    this->GeneratorTarget, this->LocalGenerator->GetBinaryDirectory());

  // Depend on all custom command outputs for sources
  this->DriveCustomCommands(depends);

  this->LocalGenerator->AppendCustomCommands(
    commands, this->GeneratorTarget->GetPostBuildCommands(),
    this->GeneratorTarget, this->LocalGenerator->GetBinaryDirectory());

  // Add dependencies on targets that must be built first.
  this->AppendTargetDepends(depends);

  // Add a dependency on the rule file itself.
  this->LocalGenerator->AppendRuleDepend(depends,
                                         this->BuildFileNameFull.c_str());

  // If the rule is empty add the special empty rule dependency needed
  // by some make tools.
  if (depends.empty() && commands.empty()) {
    std::string hack = this->GlobalGenerator->GetEmptyRuleHackDepends();
    if (!hack.empty()) {
      depends.push_back(hack);
    }
  }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, CM_NULLPTR,
                                      this->GeneratorTarget->GetName(),
                                      depends, commands, true);

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(this->GeneratorTarget->GetName(), false);

  // Write clean target
  this->WriteTargetCleanRules();

  // Write the dependency generation rule.  This must be done last so
  // that multiple output pair information is available.
  this->WriteTargetDependRules();

  // close the streams
  this->CloseFileStreams();
}